

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void Internal_SplitFaceSwapFacePtr(ON_SubDFace *f,ON__UINT_PTR *pairA,ON__UINT_PTR *pairB)

{
  unsigned_short uVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  ON__UINT_PTR OVar5;
  ON_SubDEdge *edge;
  ulong uVar6;
  ulong *puVar7;
  ON_SubDEdgePtr *pOVar8;
  unsigned_short fei;
  unsigned_short uVar9;
  ulong uVar10;
  ulong *puVar11;
  unsigned_short vfi;
  ulong uVar12;
  unsigned_short efi;
  short sVar13;
  
  if (f != (ON_SubDFace *)0x0) {
    if (((*pairA == *pairB) || (pairA[1] == *pairB)) || (*pairA == pairB[1] || pairA[1] == pairB[1])
       ) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,0x47d2,"","pairA[] and pairB[] must be disjoint sets of values.");
      return;
    }
    pOVar8 = f->m_edge4;
    uVar1 = f->m_edge_count;
    uVar9 = 0;
    while ((uVar9 != uVar1 &&
           ((uVar9 != 4 || (pOVar8 = f->m_edgex, pOVar8 != (ON_SubDEdgePtr *)0x0))))) {
      uVar12 = pOVar8->m_ptr;
      uVar6 = uVar12 & 0xfffffffffffffff8;
      if (uVar6 != 0) {
        puVar7 = (ulong *)(uVar6 + 0x68);
        sVar2 = *(short *)(uVar6 + 100);
        sVar13 = 0;
        while ((sVar2 != sVar13 &&
               ((sVar13 != 2 || (puVar7 = *(ulong **)(uVar6 + 0x78), puVar7 != (ulong *)0x0))))) {
          uVar10 = *puVar7 & 0xfffffffffffffff8;
          puVar11 = pairA + 1;
          if ((uVar10 == *pairA) || (puVar11 = pairB + 1, uVar10 == *pairB)) {
            *puVar7 = (ulong)((uint)*puVar7 & 1) | *puVar11;
          }
          sVar13 = sVar13 + 1;
          puVar7 = puVar7 + 1;
        }
        lVar4 = *(long *)(uVar6 + 0x80 + (ulong)((uint)uVar12 & 1) * 8);
        if ((lVar4 != 0) && (*(long *)(lVar4 + 0x78) != 0)) {
          uVar3 = *(ushort *)(lVar4 + 0x6a);
          for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
            OVar5 = *(ON__UINT_PTR *)(*(long *)(lVar4 + 0x78) + uVar12 * 8);
            puVar7 = pairA + 1;
            if ((*pairA == OVar5) || (puVar7 = pairB + 1, *pairB == OVar5)) {
              *(ulong *)(*(long *)(lVar4 + 0x78) + uVar12 * 8) = *puVar7;
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
      pOVar8 = pOVar8 + 1;
    }
  }
  return;
}

Assistant:

static void Internal_SplitFaceSwapFacePtr(
  ON_SubDFace* f,
  ON__UINT_PTR pairA[2],
  ON__UINT_PTR pairB[2]
  )
{
  if (nullptr == f)
    return;

  if (pairA[0] == pairB[0] || pairA[1] == pairB[0] || pairA[0] == pairB[1] || pairA[1] == pairB[1])
  {
    ON_SUBD_ERROR("pairA[] and pairB[] must be disjoint sets of values.");
    return;
  }

  ON_SubDEdgePtr* feptr = f->m_edge4;
  for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++feptr)
  {
    if (4 == fei)
    {
      feptr = f->m_edgex;
      if (nullptr == feptr)
        break;
    }

    ON_SubDEdge* fe = ON_SUBD_EDGE_POINTER(feptr->m_ptr);
    if (nullptr == fe)
      continue;

    ON_SubDFacePtr* efptr = fe->m_face2;
    for (unsigned short efi = 0; efi < fe->m_face_count; ++efi, ++efptr)
    {
      if (2 == efi)
      {
        efptr = fe->m_facex;
        if (nullptr == efptr)
          break;
      }
      const ON__UINT_PTR x = (efptr->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
      const ON__UINT_PTR d = (efptr->m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
      if (x == pairA[0])
        efptr->m_ptr = (pairA[1] | d);
      else if (x == pairB[0])
        efptr->m_ptr = (pairB[1] | d);
    }


    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(feptr->RelativeVertex(0));
    if (nullptr != v && nullptr != v->m_faces)
    {
      for (unsigned short vfi = 0; vfi < v->m_face_count; ++vfi)
      {
        const ON__UINT_PTR x = (ON__UINT_PTR)v->m_faces[vfi];
        if (x == pairA[0])
          v->m_faces[vfi] = (ON_SubDFace*)pairA[1];
        else if (x == pairB[0])
          v->m_faces[vfi] = (ON_SubDFace*)pairB[1];
      }
    }
  }
}